

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSelect
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,optional<wasm::Type> type)

{
  Select *this_00;
  Type *pTVar1;
  bool bVar2;
  Ok local_f2;
  allocator<char> local_f1;
  Err local_f0;
  uintptr_t local_d0;
  Type local_c8;
  Select *local_c0;
  Select *built;
  Err local_b0;
  Err *local_80;
  Err *err;
  Result<wasm::Ok> _val;
  Select curr;
  IRBuilder *this_local;
  optional<wasm::Type> type_local;
  
  this_local = type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
  type_local.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ =
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  this_00 = (Select *)
            ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  type_local.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = __return_storage_ptr__;
  Select::Select(this_00);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitSelect
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,this_00);
  local_80 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_80 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_b0,local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  built._4_4_ = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (built._4_4_ == 0) {
    local_c0 = Builder::makeSelect(&this->builder,curr.ifFalse,
                                   (Expression *)
                                   curr.super_SpecificExpression<(wasm::Expression::Id)17>.
                                   super_Expression.type.id,curr.ifTrue);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&this_local);
    if (bVar2) {
      local_c8.id = (local_c0->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.
                    type.id;
      pTVar1 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
      local_d0 = pTVar1->id;
      bVar2 = wasm::Type::isSubType(local_c8,(Type)local_d0);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"select type does not match expected type",&local_f1);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f0);
        wasm::Err::~Err(&local_f0);
        std::allocator<char>::~allocator(&local_f1);
        return __return_storage_ptr__;
      }
    }
    push(this,(Expression *)local_c0);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_f2);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSelect(std::optional<Type> type) {
  Select curr;
  CHECK_ERR(visitSelect(&curr));
  auto* built = builder.makeSelect(curr.condition, curr.ifTrue, curr.ifFalse);
  if (type && !Type::isSubType(built->type, *type)) {
    return Err{"select type does not match expected type"};
  }
  push(built);
  return Ok{};
}